

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor,sqlite_int64 *pRowid)

{
  byte bVar1;
  RtreeNode *pNode;
  i64 iVar2;
  int iVar3;
  sqlite3_vtab *psVar4;
  long in_FS_OFFSET;
  int rc;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)&pVtabCursor[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&pVtabCursor[4].pVtab + 4) == 0) {
      psVar4 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar4 = pVtabCursor[6].pVtab;
    }
  }
  else {
    psVar4 = (sqlite3_vtab *)(pVtabCursor + 8);
  }
  rc = 0;
  pNode = rtreeNodeOfFirstSearchPoint((RtreeCursor *)pVtabCursor,&rc);
  iVar3 = rc;
  if (psVar4 != (sqlite3_vtab *)0x0 && rc == 0) {
    bVar1 = *(byte *)((long)&psVar4->zErrMsg + 2);
    if ((ushort)bVar1 <
        (ushort)(*(ushort *)(pNode->zData + 2) << 8 | *(ushort *)(pNode->zData + 2) >> 8)) {
      iVar2 = nodeGetRowid((Rtree *)pVtabCursor->pVtab,pNode,(uint)bVar1);
      *pRowid = iVar2;
      iVar3 = 0;
    }
    else {
      iVar3 = 4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor, sqlite_int64 *pRowid){
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);
  if( rc==SQLITE_OK && ALWAYS(p) ){
    if( p->iCell>=NCELL(pNode) ){
      rc = SQLITE_ABORT;
    }else{
      *pRowid = nodeGetRowid(RTREE_OF_CURSOR(pCsr), pNode, p->iCell);
    }
  }
  return rc;
}